

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::CPPextension(TPpContext *this,TPpToken *ppToken)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  TParseContextBase *pTVar4;
  _func_int **pp_Var5;
  char extensionName [1025];
  char acStack_438 [1040];
  
  uVar1 = (ppToken->loc).line;
  iVar2 = scanToken(this,ppToken);
  if (iVar2 != 0xa2) {
    if (iVar2 == 10) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"extension name not specified","#extension","");
      return 10;
    }
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"extension name expected","#extension","");
  }
  pcVar3 = ppToken->name;
  snprintf(acStack_438,0x401,"%s",pcVar3);
  iVar2 = scanToken(this,ppToken);
  if (iVar2 == 0x3a) {
    iVar2 = scanToken(this,ppToken);
    pTVar4 = this->parseContext;
    pp_Var5 = (pTVar4->super_TParseVersions)._vptr_TParseVersions;
    if (iVar2 == 0xa2) {
      (*pp_Var5[10])(pTVar4,(ulong)uVar1,acStack_438,pcVar3);
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3f])
                (this->parseContext,(ulong)uVar1,acStack_438,pcVar3);
      iVar2 = scanToken(this,ppToken);
      if (iVar2 == 10) {
        return 10;
      }
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"extra tokens -- expected newline","#extension","");
      return iVar2;
    }
    pcVar3 = "behavior for extension not specified";
  }
  else {
    pTVar4 = this->parseContext;
    pp_Var5 = (pTVar4->super_TParseVersions)._vptr_TParseVersions;
    pcVar3 = "\':\' missing after extension name";
  }
  (*pp_Var5[0x2f])(pTVar4,ppToken,pcVar3,"#extension","");
  return iVar2;
}

Assistant:

int TPpContext::CPPextension(TPpToken* ppToken)
{
    int line = ppToken->loc.line;
    int token = scanToken(ppToken);
    char extensionName[MaxTokenLength + 1];

    if (token=='\n') {
        parseContext.ppError(ppToken->loc, "extension name not specified", "#extension", "");
        return token;
    }

    if (token != PpAtomIdentifier)
        parseContext.ppError(ppToken->loc, "extension name expected", "#extension", "");

    snprintf(extensionName, sizeof(extensionName), "%s", ppToken->name);

    token = scanToken(ppToken);
    if (token != ':') {
        parseContext.ppError(ppToken->loc, "':' missing after extension name", "#extension", "");
        return token;
    }

    token = scanToken(ppToken);
    if (token != PpAtomIdentifier) {
        parseContext.ppError(ppToken->loc, "behavior for extension not specified", "#extension", "");
        return token;
    }

    parseContext.updateExtensionBehavior(line, extensionName, ppToken->name);
    parseContext.notifyExtensionDirective(line, extensionName, ppToken->name);

    token = scanToken(ppToken);
    if (token == '\n')
        return token;
    else
        parseContext.ppError(ppToken->loc,  "extra tokens -- expected newline", "#extension","");

    return token;
}